

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDY_AB_X(CPU *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint16_t address;
  CPU *this_local;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  uVar1 = ReadByte(this,uVar2 + this->X);
  this->Y = uVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->Y == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->Y & 0x80) != 0 && -1 < (int)(this->Y & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDY_AB_X()
{
    cycles = 4;
    uint16_t address = GetWord();
    Y = ReadByte(address + X);
    Z = (Y == 0);
    N = (Y & 0b10000000) > 0;
}